

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int __thiscall ncnn::GRU::load_model(GRU *this,ModelBin *mb)

{
  int *piVar1;
  ulong uVar2;
  void **ppvVar3;
  long *in_RSI;
  long in_RDI;
  bool bVar4;
  int size;
  int num_directions;
  void *local_2a0;
  int *local_298;
  long *local_280;
  void *local_258;
  int *local_250;
  undefined8 local_248;
  undefined4 local_240;
  long *local_238;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined8 local_218;
  void *local_200;
  int *local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  long *local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  int local_1b4;
  long *local_1b0;
  int local_19c;
  void **local_198;
  void **local_188;
  void **local_178;
  int local_168;
  undefined4 local_164;
  void **local_160;
  void **local_158;
  void **local_150;
  int local_148;
  undefined4 local_144;
  void **local_140;
  void **local_138;
  void **local_130;
  int local_128;
  undefined4 local_124;
  void **local_120;
  void **local_118;
  void **local_110;
  long *local_100;
  long *local_f8;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  void *local_30;
  void *local_28;
  void *local_20;
  long *local_18;
  long *local_10;
  
  local_1b4 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_1b4 = 2;
  }
  uVar2 = (long)*(int *)(in_RDI + 0xd4) / (long)local_1b4;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
          (long)*(int *)(in_RDI + 0xd0);
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 3;
  local_1b8 = (undefined4)uVar2;
  local_1b0 = in_RSI;
  (**(code **)(*in_RSI + 0x20))
            (&local_200,in_RSI,uVar2 & 0xffffffff,*(int *)(in_RDI + 0xd0) * 3,local_1b4,0);
  ppvVar3 = (void **)(in_RDI + 0x128);
  local_120 = &local_200;
  local_118 = ppvVar3;
  if (ppvVar3 != local_120) {
    if (local_1f8 != (int *)0x0) {
      local_124 = 1;
      LOCK();
      local_128 = *local_1f8;
      *local_1f8 = *local_1f8 + 1;
      UNLOCK();
    }
    local_e8 = ppvVar3;
    if (*(long *)(in_RDI + 0x130) != 0) {
      piVar1 = *(int **)(in_RDI + 0x130);
      local_ec = 0xffffffff;
      LOCK();
      local_f0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_f0 == 1) {
        if (*(long *)(in_RDI + 0x148) == 0) {
          local_20 = *ppvVar3;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x148) + 0x18))(*(long **)(in_RDI + 0x148),*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *(undefined4 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x150) = 0;
    *(undefined4 *)(in_RDI + 0x154) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined8 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *ppvVar3 = *local_120;
    *(void **)(in_RDI + 0x130) = local_120[1];
    *(void **)(in_RDI + 0x138) = local_120[2];
    *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(local_120 + 3);
    *(void **)(in_RDI + 0x148) = local_120[4];
    *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_120 + 5);
    *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_120 + 0x2c);
    *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_120 + 6);
    *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_120 + 0x34);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_120 + 7);
    *(void **)(in_RDI + 0x168) = local_120[8];
  }
  local_198 = &local_200;
  local_110 = ppvVar3;
  local_68 = local_198;
  if (local_1f8 != (int *)0x0) {
    local_6c = 0xffffffff;
    LOCK();
    local_70 = *local_1f8;
    *local_1f8 = *local_1f8 + -1;
    UNLOCK();
    if (local_70 == 1) {
      if (local_1e0 == (long *)0x0) {
        if (local_200 != (void *)0x0) {
          free(local_200);
        }
      }
      else {
        (**(code **)(*local_1e0 + 0x18))(local_1e0,local_200);
      }
    }
  }
  local_200 = (void *)0x0;
  local_1f0 = 0;
  local_1e8 = 0;
  local_1d8 = 0;
  local_1d4 = 0;
  local_1d0 = 0;
  local_1cc = 0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1f8 = (int *)0x0;
  local_f8 = (long *)(in_RDI + 0x128);
  bVar4 = true;
  if (*local_f8 != 0) {
    bVar4 = *(long *)(in_RDI + 0x168) * (long)*(int *)(in_RDI + 0x160) == 0;
    local_18 = local_f8;
  }
  if (bVar4) {
    local_19c = -100;
  }
  else {
    (**(code **)(*local_1b0 + 0x20))
              (&local_258,local_1b0,*(undefined4 *)(in_RDI + 0xd0),4,local_1b4,0);
    ppvVar3 = (void **)(in_RDI + 0x170);
    local_140 = &local_258;
    local_138 = ppvVar3;
    if (ppvVar3 != local_140) {
      if (local_250 != (int *)0x0) {
        local_144 = 1;
        LOCK();
        local_148 = *local_250;
        *local_250 = *local_250 + 1;
        UNLOCK();
      }
      local_d8 = ppvVar3;
      if (*(long *)(in_RDI + 0x178) != 0) {
        piVar1 = *(int **)(in_RDI + 0x178);
        local_dc = 0xffffffff;
        LOCK();
        local_e0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_e0 == 1) {
          if (*(long *)(in_RDI + 400) == 0) {
            local_28 = *ppvVar3;
            if (local_28 != (void *)0x0) {
              free(local_28);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*ppvVar3);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x180) = 0;
      *(undefined4 *)(in_RDI + 0x188) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined4 *)(in_RDI + 0x1a4) = 0;
      *(undefined4 *)(in_RDI + 0x1a8) = 0;
      *(undefined8 *)(in_RDI + 0x1b0) = 0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *ppvVar3 = *local_140;
      *(void **)(in_RDI + 0x178) = local_140[1];
      *(void **)(in_RDI + 0x180) = local_140[2];
      *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_140 + 3);
      *(void **)(in_RDI + 400) = local_140[4];
      *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_140 + 5);
      *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_140 + 0x2c);
      *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_140 + 6);
      *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_140 + 0x34);
      *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_140 + 7);
      *(void **)(in_RDI + 0x1b0) = local_140[8];
    }
    local_188 = &local_258;
    local_130 = ppvVar3;
    local_88 = local_188;
    if (local_250 != (int *)0x0) {
      local_8c = 0xffffffff;
      LOCK();
      local_90 = *local_250;
      *local_250 = *local_250 + -1;
      UNLOCK();
      if (local_90 == 1) {
        if (local_238 == (long *)0x0) {
          if (local_258 != (void *)0x0) {
            free(local_258);
          }
        }
        else {
          (**(code **)(*local_238 + 0x18))(local_238,local_258);
        }
      }
    }
    local_258 = (void *)0x0;
    local_248 = 0;
    local_240 = 0;
    local_230 = 0;
    local_22c = 0;
    local_228 = 0;
    local_224 = 0;
    local_220 = 0;
    local_218 = 0;
    local_250 = (int *)0x0;
    local_100 = (long *)(in_RDI + 0x170);
    bVar4 = true;
    if (*local_100 != 0) {
      bVar4 = *(long *)(in_RDI + 0x1b0) * (long)*(int *)(in_RDI + 0x1a8) == 0;
      local_10 = local_100;
    }
    if (bVar4) {
      local_19c = -100;
    }
    else {
      (**(code **)(*local_1b0 + 0x20))
                (&local_2a0,local_1b0,*(undefined4 *)(in_RDI + 0xd0),*(int *)(in_RDI + 0xd0) * 3,
                 local_1b4,0);
      ppvVar3 = (void **)(in_RDI + 0xe0);
      local_160 = &local_2a0;
      local_158 = ppvVar3;
      if (ppvVar3 != local_160) {
        if (local_298 != (int *)0x0) {
          local_164 = 1;
          LOCK();
          local_168 = *local_298;
          *local_298 = *local_298 + 1;
          UNLOCK();
        }
        local_c8 = ppvVar3;
        if (*(long *)(in_RDI + 0xe8) != 0) {
          piVar1 = *(int **)(in_RDI + 0xe8);
          local_cc = 0xffffffff;
          LOCK();
          local_d0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_d0 == 1) {
            if (*(long *)(in_RDI + 0x100) == 0) {
              local_30 = *ppvVar3;
              if (local_30 != (void *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x100) + 0x18))(*(long **)(in_RDI + 0x100),*ppvVar3)
              ;
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0xf0) = 0;
        *(undefined4 *)(in_RDI + 0xf8) = 0;
        *(undefined4 *)(in_RDI + 0x108) = 0;
        *(undefined4 *)(in_RDI + 0x10c) = 0;
        *(undefined4 *)(in_RDI + 0x110) = 0;
        *(undefined4 *)(in_RDI + 0x114) = 0;
        *(undefined4 *)(in_RDI + 0x118) = 0;
        *(undefined8 *)(in_RDI + 0x120) = 0;
        *(undefined8 *)(in_RDI + 0xe8) = 0;
        *ppvVar3 = *local_160;
        *(void **)(in_RDI + 0xe8) = local_160[1];
        *(void **)(in_RDI + 0xf0) = local_160[2];
        *(undefined4 *)(in_RDI + 0xf8) = *(undefined4 *)(local_160 + 3);
        *(void **)(in_RDI + 0x100) = local_160[4];
        *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(local_160 + 5);
        *(undefined4 *)(in_RDI + 0x10c) = *(undefined4 *)((long)local_160 + 0x2c);
        *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_160 + 6);
        *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_160 + 0x34);
        *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_160 + 7);
        *(void **)(in_RDI + 0x120) = local_160[8];
      }
      local_178 = &local_2a0;
      if (local_298 != (int *)0x0) {
        local_ac = 0xffffffff;
        LOCK();
        local_b0 = *local_298;
        *local_298 = *local_298 + -1;
        UNLOCK();
        if (local_b0 == 1) {
          local_150 = ppvVar3;
          local_a8 = local_178;
          if (local_280 == (long *)0x0) {
            if (local_2a0 != (void *)0x0) {
              free(local_2a0);
            }
          }
          else {
            (**(code **)(*local_280 + 0x18))(local_280,local_2a0);
          }
        }
      }
      bVar4 = true;
      if (*(long *)(in_RDI + 0xe0) != 0) {
        bVar4 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
      }
      if (bVar4) {
        local_19c = -100;
      }
      else {
        local_19c = 0;
      }
    }
  }
  return local_19c;
}

Assistant:

int GRU::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output / 3;

    // raw weight data
    weight_xc_data = mb.load(size, num_output * 3, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output * 3, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    return 0;
}